

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void handle_error(cio_http_server *server,char *reason)

{
  char *reason_local;
  cio_http_server *server_local;
  
  if (server->on_error != (cio_http_serve_on_error_t)0x0) {
    (*server->on_error)(server,reason);
  }
  return;
}

Assistant:

static void handle_error(struct cio_websocket *websocket, enum cio_error err, enum cio_websocket_status_code status_code, const char *reason)
{
	if (websocket->ws_private.ws_flags.closed_by_error == 0U) {
		websocket->ws_private.ws_flags.closed_by_error = 1U;
		if (websocket->on_error != NULL) {
			websocket->on_error(websocket, err, reason);
		}

		abort_write_jobs(websocket);
		prepare_close_job_string(websocket, status_code, reason, NULL, NULL, close_frame_written_immediate_close);

		size_t length = cio_write_buffer_get_total_size(websocket->ws_private.write_close_job.wbh);
		if (enqueue_job(websocket, &websocket->ws_private.write_close_job, length) != CIO_SUCCESS) {
			close(websocket);
		}
	}
}